

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

void __thiscall soul::TaskThread::waitForThreadToFinish(TaskThread *this)

{
  int line;
  pthread_t pVar1;
  char *message;
  thread local_18;
  
  pVar1 = pthread_self();
  if (pVar1 == (this->thread)._M_id._M_thread) {
    message = "std::this_thread::get_id() != thread.get_id()";
    line = 0x37;
  }
  else {
    if ((this->shuttingDown).super___atomic_base<int>._M_i != 0) {
      if ((this->thread)._M_id._M_thread != 0) {
        std::thread::join();
        local_18._M_id._M_thread = (id)0;
        std::thread::operator=(&this->thread,&local_18);
        std::thread::~thread(&local_18);
      }
      return;
    }
    message = "shuttingDown";
    line = 0x38;
  }
  throwInternalCompilerError(message,"waitForThreadToFinish",line);
}

Assistant:

void waitForThreadToFinish()
    {
        SOUL_ASSERT (std::this_thread::get_id() != thread.get_id());
        SOUL_ASSERT (shuttingDown);

        if (thread.joinable())
        {
            thread.join();
            thread = {};
        }
    }